

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Allocator.h
# Opt level: O3

void __thiscall
llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>::Reset
          (BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL> *this)

{
  uint uVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  long *plVar6;
  
  uVar1 = *(uint *)(this + 0x48);
  if ((ulong)uVar1 != 0) {
    lVar5 = *(long *)(this + 0x40);
    lVar3 = 0;
    do {
      free(*(void **)(lVar5 + lVar3));
      lVar3 = lVar3 + 0x10;
    } while ((ulong)uVar1 << 4 != lVar3);
  }
  *(undefined4 *)(this + 0x48) = 0;
  uVar4 = (ulong)*(uint *)(this + 0x18);
  if (uVar4 != 0) {
    *(undefined8 *)(this + 0x50) = 0;
    plVar6 = *(long **)(this + 0x10);
    lVar5 = *plVar6;
    *(long *)this = lVar5;
    *(long *)(this + 8) = lVar5 + 0x1000;
    uVar2 = 1;
    if (uVar4 != 1) {
      lVar5 = 8;
      do {
        free(*(void **)((long)plVar6 + lVar5));
        lVar5 = lVar5 + 8;
      } while (uVar4 << 3 != lVar5);
      plVar6 = *(long **)(this + 0x10);
      uVar2 = (ulong)*(uint *)(this + 0x18);
    }
    SmallVectorImpl<void_*>::erase
              ((SmallVectorImpl<void_*> *)(this + 0x10),(const_iterator)(plVar6 + 1),
               (const_iterator)(plVar6 + uVar2));
    return;
  }
  return;
}

Assistant:

void Reset() {
    // Deallocate all but the first slab, and deallocate all custom-sized slabs.
    DeallocateCustomSizedSlabs();
    CustomSizedSlabs.clear();

    if (Slabs.empty())
      return;

    // Reset the state.
    BytesAllocated = 0;
    CurPtr = (char *)Slabs.front();
    End = CurPtr + SlabSize;

    __asan_poison_memory_region(*Slabs.begin(), computeSlabSize(0));
    DeallocateSlabs(std::next(Slabs.begin()), Slabs.end());
    Slabs.erase(std::next(Slabs.begin()), Slabs.end());
  }